

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectPoller.cpp
# Opt level: O1

void __thiscall sznet::net::SelectPoller::updateChannel(SelectPoller *this,Channel *channel)

{
  ChannelMap *this_00;
  _Rb_tree_header *p_Var1;
  pointer *ppEVar2;
  EventLoop *this_01;
  char *pcVar3;
  pointer pEVar4;
  iterator __position;
  Event_t EVar5;
  bool bVar6;
  LogStream *this_02;
  mapped_type *ppCVar7;
  long lVar8;
  char **ppcVar9;
  _Rb_tree_header *p_Var10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  SourceFile file;
  undefined1 local_ff0 [8];
  Event_t event;
  char *local_40 [4];
  
  this_01 = (this->super_Poller).m_ownerLoop;
  bVar6 = EventLoop::isInLoopThread(this_01);
  if (!bVar6) {
    EventLoop::abortNotInLoopThread(this_01);
  }
  if (g_logLevel < 1) {
    file._8_8_ = 0x10;
    file.m_data = "SelectPoller.cpp";
    Logger::Logger((Logger *)local_ff0,file,0x70,TRACE,"updateChannel");
    if (5 < (uint)((int)local_40 - (int)local_40[0])) {
      builtin_strncpy(local_40[0],"fd = ",5);
      local_40[0] = local_40[0] + 5;
    }
    this_02 = LogStream::operator<<((LogStream *)&event,channel->m_fd);
    ppcVar9 = &(this_02->m_buffer).m_cur;
    pcVar3 = (this_02->m_buffer).m_cur;
    if (10 < (uint)((int)ppcVar9 - (int)pcVar3)) {
      builtin_strncpy(pcVar3," events = ",10);
      *ppcVar9 = *ppcVar9 + 10;
    }
    LogStream::operator<<(this_02,channel->m_events);
    Logger::~Logger((Logger *)local_ff0);
  }
  this_00 = &(this->super_Poller).m_channels;
  p_Var1 = &(this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header;
  local_ff0._0_4_ = channel->m_fd;
  p_Var11 = (this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var12 = &p_Var1->_M_header;
  if (channel->m_index < 0) {
    for (; p_Var11 != (_Base_ptr)0x0;
        p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < (int)local_ff0._0_4_]) {
      if ((int)local_ff0._0_4_ <= (int)p_Var11[1]._M_color) {
        p_Var12 = p_Var11;
      }
    }
    p_Var11 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
       (p_Var11 = p_Var12, (int)local_ff0._0_4_ < (int)p_Var12[1]._M_color)) {
      p_Var11 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var11 != p_Var1) {
      __assert_fail("m_channels.find(channel->fd()) == m_channels.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x74,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
    }
    local_ff0._4_4_ = channel->m_events;
    __position._M_current =
         (this->m_pollfds).
         super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_pollfds).
        super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<sznet::net::Channel::Event_t,std::allocator<sznet::net::Channel::Event_t>>::
      _M_realloc_insert<sznet::net::Channel::Event_t_const&>
                ((vector<sznet::net::Channel::Event_t,std::allocator<sznet::net::Channel::Event_t>>
                  *)&this->m_pollfds,__position,(Event_t *)local_ff0);
    }
    else {
      EVar5.ev = local_ff0._4_4_;
      EVar5.fd = local_ff0._0_4_;
      *__position._M_current = EVar5;
      ppEVar2 = &(this->m_pollfds).
                 super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppEVar2 = *ppEVar2 + 1;
    }
    channel->m_index =
         (int)((ulong)((long)(this->m_pollfds).
                             super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_pollfds).
                            super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    ppCVar7 = std::
              map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
              ::operator[](this_00,(key_type_conflict *)local_ff0);
    *ppCVar7 = channel;
  }
  else {
    for (; (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
        p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < (int)local_ff0._0_4_]) {
      if ((int)local_ff0._0_4_ <= (int)*(size_t *)(p_Var11 + 1)) {
        p_Var12 = p_Var11;
      }
    }
    p_Var10 = p_Var1;
    if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
       (p_Var10 = (_Rb_tree_header *)p_Var12,
       (int)local_ff0._0_4_ < (int)((_Rb_tree_header *)p_Var12)->_M_node_count)) {
      p_Var10 = p_Var1;
    }
    if (p_Var10 == p_Var1) {
      __assert_fail("m_channels.find(channel->fd()) != m_channels.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x81,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
    }
    ppCVar7 = std::
              map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
              ::operator[](this_00,(key_type_conflict *)local_ff0);
    if (*ppCVar7 != channel) {
      __assert_fail("m_channels[channel->fd()] == channel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x82,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
    }
    lVar8 = (long)channel->m_index;
    if ((lVar8 < 0) ||
       (pEVar4 = (this->m_pollfds).
                 super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (int)((ulong)((long)(this->m_pollfds).
                           super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4) >> 3) <=
       channel->m_index)) {
      __assert_fail("0 <= idx && idx < static_cast<int>(m_pollfds.size())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x84,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
    }
    if (pEVar4[lVar8].fd != channel->m_fd) {
      __assert_fail("event.fd == channel->fd()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x86,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
    }
    pEVar4[lVar8].ev = channel->m_events;
  }
  return;
}

Assistant:

void SelectPoller::updateChannel(Channel* channel)
{
	Poller::assertInLoopThread();
	LOG_TRACE << "fd = " << channel->fd() << " events = " << channel->events();
	// add
	if (channel->index() < 0)
	{
		assert(m_channels.find(channel->fd()) == m_channels.end());
		Channel::Event_t event;
		event.fd = channel->fd();
		event.ev = channel->events();
		m_pollfds.push_back(event);
		int idx = static_cast<int>(m_pollfds.size()) - 1;
		channel->set_index(idx);
		m_channels[event.fd] = channel;
	}
	// mod
	else
	{
		// channel事件有能为kNoneEvent
		assert(m_channels.find(channel->fd()) != m_channels.end());
		assert(m_channels[channel->fd()] == channel);
		int idx = channel->index();
		assert(0 <= idx && idx < static_cast<int>(m_pollfds.size()));
		Channel::Event_t& event = m_pollfds[idx];
		assert(event.fd == channel->fd());
		event.ev = channel->events();
	}
}